

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_3_2::RgbaYca::RGBAtoYCA(V3f *yw,int n,bool aIsValid,Rgba *rgbaIn,Rgba *ycaOut)

{
  bool bVar1;
  long lVar2;
  long in_RCX;
  byte in_DL;
  int in_ESI;
  int iVar3;
  undefined4 *in_RDI;
  long in_R8;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float Y;
  Rgba *out;
  Rgba in;
  int i;
  float in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  undefined8 local_2c;
  int local_24;
  long local_20;
  long local_18;
  byte local_d;
  int local_c;
  undefined4 *local_8;
  
  local_d = in_DL & 1;
  local_24 = 0;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_c = in_ESI;
  local_8 = in_RDI;
  do {
    if (local_c <= local_24) {
      return;
    }
    local_2c = *(undefined8 *)(local_18 + (long)local_24 * 8);
    lVar2 = local_20 + (long)local_24 * 8;
    bVar1 = Imath_3_2::half::isFinite((half *)0x24f8d8);
    if ((!bVar1) ||
       (fVar4 = Imath_3_2::half::operator_cast_to_float
                          ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
       fVar4 < 0.0)) {
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    }
    bVar1 = Imath_3_2::half::isFinite((half *)0x24f90e);
    if ((!bVar1) ||
       (fVar4 = Imath_3_2::half::operator_cast_to_float
                          ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
       fVar4 < 0.0)) {
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    }
    bVar1 = Imath_3_2::half::isFinite((half *)0x24f94c);
    if ((!bVar1) ||
       (fVar4 = Imath_3_2::half::operator_cast_to_float
                          ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
       fVar4 < 0.0)) {
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    }
    fVar4 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    fVar5 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
LAB_0024fa0d:
      in_stack_ffffffffffffffb4 =
           Imath_3_2::half::operator_cast_to_float
                     ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      in_stack_ffffffffffffffb0 = *local_8;
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      fVar4 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      iVar3 = (int)&local_2c;
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      std::abs(iVar3);
      if (fVar4 * 65504.0 <= extraout_XMM0_Da) {
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
      }
      else {
        Imath_3_2::half::operator_cast_to_float
                  ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
      }
      iVar3 = (int)&local_2c + 4;
      Imath_3_2::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      std::abs(iVar3);
      if (fVar4 * 65504.0 <= extraout_XMM0_Da_00) {
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
      }
      else {
        Imath_3_2::half::operator_cast_to_float
                  ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
      }
    }
    else {
      fVar4 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      fVar5 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) goto LAB_0024fa0d;
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      *(undefined2 *)(lVar2 + 2) = local_2c._2_2_;
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    }
    if ((local_d & 1) == 0) {
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    }
    else {
      *(undefined2 *)(lVar2 + 6) = local_2c._6_2_;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void
RGBAtoYCA (
    const V3f& yw,
    int        n,
    bool       aIsValid,
    const Rgba rgbaIn[/*n*/],
    Rgba       ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        Rgba  in  = rgbaIn[i];
        Rgba& out = ycaOut[i];

        //
        // Conversion to YCA and subsequent chroma subsampling
        // work only if R, G and B are finite and non-negative.
        //

        if (!in.r.isFinite () || in.r < 0) in.r = 0;

        if (!in.g.isFinite () || in.g < 0) in.g = 0;

        if (!in.b.isFinite () || in.b < 0) in.b = 0;

        if (in.r == in.g && in.g == in.b)
        {
            //
            // Special case -- R, G and B are equal. To avoid rounding
            // errors, we explicitly set the output luminance channel
            // to G, and the chroma channels to 0.
            //
            // The special cases here and in YCAtoRGBA() ensure that
            // converting black-and white images from RGBA to YCA and
            // back is lossless.
            //

            out.r = 0;
            out.g = in.g;
            out.b = 0;
        }
        else
        {
            out.g = in.r * yw.x + in.g * yw.y + in.b * yw.z;

            float Y = out.g;

            if (abs (in.r - Y) < HALF_MAX * Y)
                out.r = (in.r - Y) / Y;
            else
                out.r = 0;

            if (abs (in.b - Y) < HALF_MAX * Y)
                out.b = (in.b - Y) / Y;
            else
                out.b = 0;
        }

        if (aIsValid)
            out.a = in.a;
        else
            out.a = 1;
    }
}